

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O1

uint ts_subtree_get_changed_ranges
               (Subtree *old_tree,Subtree *new_tree,TreeCursor *cursor1,TreeCursor *cursor2,
               TSLanguage *language,TSRangeArray *included_range_differences,TSRange **ranges)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  SubtreeHeapData *pSVar4;
  uint uVar5;
  undefined4 uVar6;
  bool bVar7;
  _Bool _Var8;
  IteratorComparison IVar10;
  uint uVar11;
  _Bool _Var9;
  long lVar12;
  uint32_t *puVar13;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar19;
  Iterator *self;
  uint32_t uVar21;
  ulong uVar22;
  Length end;
  Length LVar23;
  Length LVar24;
  Length start;
  Length end_00;
  Length end_01;
  Length result;
  TSRangeArray results;
  Iterator new_iter;
  Iterator old_iter;
  uint32_t local_108;
  ulong local_100;
  uint32_t local_f4;
  undefined4 uStack_ec;
  uint32_t uStack_e8;
  TSRangeArray local_d8;
  ulong local_c8;
  int local_c0;
  int iStack_bc;
  uint local_b8;
  uint local_b0;
  uint uStack_ac;
  uint32_t local_a8;
  Subtree *local_a0;
  Subtree *local_98;
  TreeCursor *local_90;
  TreeCursor *local_88;
  Iterator local_80;
  Iterator local_58;
  undefined8 uVar14;
  undefined8 uVar18;
  uint32_t uVar20;
  
  local_d8.contents = (TSRange *)0x0;
  local_d8.size = 0;
  local_d8.capacity = 0;
  local_a0 = old_tree;
  local_90 = cursor1;
  iterator_new(&local_58,cursor1,old_tree,language);
  local_98 = new_tree;
  local_88 = cursor2;
  iterator_new(&local_80,cursor2,new_tree,language);
  end = iterator_start_position(&local_58);
  LVar23 = iterator_start_position(&local_80);
  uVar17 = LVar23.bytes;
  uVar22 = (ulong)uVar17;
  if (end.bytes < uVar17) {
    ts_range_array_add(&local_d8,end,LVar23);
    end = LVar23;
  }
  else if (uVar17 < end.bytes) {
    ts_range_array_add(&local_d8,LVar23,end);
    uVar22 = end._0_8_ & 0xffffffff;
    LVar23 = end;
  }
  LVar24.extent.column = LVar23.extent.column;
  LVar24.bytes = (int)uVar22;
  LVar24.extent.row = (int)(uVar22 >> 0x20);
  local_100 = LVar23._0_8_ >> 0x20;
  uVar17 = 0;
  do {
    local_f4 = end.extent.column;
    local_c8 = end._0_8_;
    IVar10 = iterator_compare(&local_58,&local_80);
    if (IVar10 == IteratorDiffers) {
      LVar23 = iterator_end_position(&local_58);
      LVar24 = iterator_end_position(&local_80);
      if (LVar23.bytes < LVar24.bytes) {
        LVar24 = LVar23;
      }
LAB_00127a44:
      local_100 = LVar24._0_8_ >> 0x20;
      bVar7 = true;
    }
    else {
      if (IVar10 == IteratorMayDiffer) {
LAB_0012795a:
        uVar21 = (uint32_t)local_c8;
        _Var8 = iterator_descend(&local_58,uVar21);
        _Var9 = iterator_descend(&local_80,uVar21);
        if (_Var8) {
          self = &local_58;
          if (!_Var9) {
LAB_00127a39:
            LVar24 = iterator_end_position(self);
            goto LAB_00127a44;
          }
        }
        else {
          self = &local_80;
          if (_Var9) goto LAB_00127a39;
          LVar23 = iterator_end_position(&local_58);
          LVar24 = iterator_end_position(&local_80);
          if (LVar23.bytes < LVar24.bytes) {
            LVar24 = LVar23;
          }
          local_100 = LVar24._0_8_ >> 0x20;
        }
      }
      else {
        LVar24 = iterator_end_position(&local_58);
        local_100 = LVar24._0_8_ >> 0x20;
        if (uVar17 < included_range_differences->size) {
          puVar13 = &included_range_differences->contents[uVar17].end_byte;
          lVar12 = (ulong)included_range_differences->size - (ulong)uVar17;
          do {
            if ((uint)local_c8 < *puVar13) {
              iVar19 = 2 - (uint)(puVar13[-1] < LVar24.bytes);
              goto LAB_00127a1e;
            }
            puVar13 = puVar13 + 6;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          iVar19 = 2;
LAB_00127a1e:
          if (iVar19 != 2) {
            local_100 = local_c8 >> 0x20;
            LVar24.extent.column = local_f4;
            LVar24.bytes = (int)(local_c8 & 0xffffffff);
            LVar24.extent.row = (int)((local_c8 & 0xffffffff) >> 0x20);
            goto LAB_0012795a;
          }
        }
      }
      bVar7 = false;
    }
    while( true ) {
      local_108 = LVar24.extent.column;
      uVar2 = LVar24.bytes;
      if ((local_58.cursor.stack.size == 0) ||
         (LVar23 = iterator_end_position(&local_58), uVar2 < LVar23.bytes)) break;
      iterator_advance(&local_58);
    }
    while ((uVar5 = local_80.visible_depth, local_80.cursor.stack.size != 0 &&
           (LVar23 = iterator_end_position(&local_80), uVar5 = local_80.visible_depth,
           LVar23.bytes <= uVar2))) {
      iterator_advance(&local_80);
    }
    while (uVar11 = local_58.visible_depth, uVar5 < local_58.visible_depth) {
      iterator_ascend(&local_58);
    }
    while (uVar11 < local_80.visible_depth) {
      iterator_ascend(&local_80);
    }
    uVar22 = LVar24._0_8_ & 0xffffffff;
    if (bVar7) {
      LVar23.extent.column = local_f4;
      LVar23.bytes = (undefined4)local_c8;
      LVar23.extent.row = local_c8._4_4_;
      end_00.extent.column = local_108;
      end_00._0_8_ = uVar22 + (local_100 << 0x20);
      ts_range_array_add(&local_d8,LVar23,end_00);
    }
    uVar22 = uVar22 | local_100 << 0x20;
    uVar5 = included_range_differences->size;
    uVar11 = uVar5;
    if (uVar5 < uVar17) {
      uVar11 = uVar17;
    }
    end.extent.column = local_108;
    end.bytes = (int)uVar22;
    end.extent.row = (int)(uVar22 >> 0x20);
    do {
      uVar16 = uVar17;
      uVar17 = uVar11;
      if (uVar5 <= uVar16) goto LAB_00127b74;
      uVar1 = included_range_differences->contents[uVar16].end_byte;
      uVar17 = uVar16 + 1;
    } while (uVar1 <= uVar2);
    uVar17 = (uVar16 - (uVar2 < uVar1)) + 1;
LAB_00127b74:
    if ((local_58.cursor.stack.size == 0) || (local_80.cursor.stack.size == 0)) {
      pSVar4 = local_a0->ptr;
      if (((ulong)pSVar4 & 1) == 0) {
        uVar2 = (pSVar4->padding).bytes;
        uVar5 = (pSVar4->padding).extent.row;
        uVar17 = (pSVar4->padding).extent.column;
      }
      else {
        uVar2 = (uint)((ulong)pSVar4 >> 0x10) & 0xff;
        uVar17 = (uint)((ulong)pSVar4 >> 0x20);
        uVar5 = uVar17 >> 8 & 0xf;
        uVar17 = uVar17 & 0xff;
      }
      if (((ulong)pSVar4 & 1) == 0) {
        uVar22._0_4_ = (pSVar4->size).bytes;
        uVar22._4_4_ = (pSVar4->size).extent.row;
        uVar11 = (pSVar4->size).extent.column;
        iVar19 = uVar22._4_4_;
      }
      else {
        uVar11 = (uint)pSVar4 >> 0x18;
        uVar22 = (ulong)uVar11;
        iVar19 = 0;
      }
      uVar2 = (int)uVar22 + uVar2;
      uVar15 = CONCAT44(uVar17,uVar5) + CONCAT44(uVar11,iVar19);
      uVar22 = uVar15 & 0xffffffff | (ulong)uVar11 << 0x20;
      if (iVar19 == 0) {
        uVar22 = uVar15;
      }
      uStack_ec = (undefined4)uVar22;
      uStack_e8 = (uint32_t)(uVar22 >> 0x20);
      uVar21 = uStack_e8;
      pSVar4 = local_98->ptr;
      if (((ulong)pSVar4 & 1) == 0) {
        uVar3 = (pSVar4->padding).bytes;
        uVar6 = (pSVar4->padding).extent.row;
        local_a8 = (pSVar4->padding).extent.column;
        uStack_ac = uVar6;
        local_b0 = uVar3;
      }
      else {
        local_b0 = (uint)((ulong)pSVar4 >> 0x10) & 0xff;
        uVar17 = (uint)((ulong)pSVar4 >> 0x20);
        uStack_ac = uVar17 >> 8 & 0xf;
        local_a8 = uVar17 & 0xff;
      }
      uVar18 = CONCAT44(uStack_ec,uVar2);
      if (((ulong)pSVar4 & 1) == 0) {
        uVar15._0_4_ = (pSVar4->size).bytes;
        uVar15._4_4_ = (pSVar4->size).extent.row;
        local_b8 = (pSVar4->size).extent.column;
        iStack_bc = uVar15._4_4_;
      }
      else {
        local_b8 = (uint)pSVar4 >> 0x18;
        iStack_bc = 0;
        uVar15 = (ulong)local_b8;
      }
      local_c0 = (int)uVar15;
      uVar17 = local_c0 + local_b0;
      uVar15 = CONCAT44(local_a8,uStack_ac) + CONCAT44(local_b8,iStack_bc);
      uVar22 = uVar15 & 0xffffffff | (ulong)local_b8 << 0x20;
      if (iStack_bc == 0) {
        uVar22 = uVar15;
      }
      uStack_ec = (undefined4)uVar22;
      uStack_e8 = (uint32_t)(uVar22 >> 0x20);
      uVar14 = CONCAT44(uStack_ec,uVar17);
      uVar20 = uStack_e8;
      if ((uVar2 < uVar17) ||
         (uVar14 = uVar18, uVar18 = CONCAT44(uStack_ec,uVar17), uVar20 = uVar21, uVar21 = uStack_e8,
         uVar17 < uVar2)) {
        start.extent.column = uVar21;
        start.bytes = (int)uVar18;
        start.extent.row = (int)((ulong)uVar18 >> 0x20);
        end_01.extent.column = uVar20;
        end_01.bytes = (int)uVar14;
        end_01.extent.row = (int)((ulong)uVar14 >> 0x20);
        ts_range_array_add(&local_d8,start,end_01);
      }
      (local_90->stack).size = local_58.cursor.stack.size;
      (local_90->stack).capacity = local_58.cursor.stack.capacity;
      local_90->tree = local_58.cursor.tree;
      (local_90->stack).contents = local_58.cursor.stack.contents;
      (local_88->stack).size = local_80.cursor.stack.size;
      (local_88->stack).capacity = local_80.cursor.stack.capacity;
      local_88->tree = local_80.cursor.tree;
      (local_88->stack).contents = local_80.cursor.stack.contents;
      *ranges = local_d8.contents;
      return local_d8.size;
    }
  } while( true );
}

Assistant:

unsigned ts_subtree_get_changed_ranges(const Subtree *old_tree, const Subtree *new_tree,
                                       TreeCursor *cursor1, TreeCursor *cursor2,
                                       const TSLanguage *language,
                                       const TSRangeArray *included_range_differences,
                                       TSRange **ranges) {
  TSRangeArray results = array_new();

  Iterator old_iter = iterator_new(cursor1, old_tree, language);
  Iterator new_iter = iterator_new(cursor2, new_tree, language);

  unsigned included_range_difference_index = 0;

  Length position = iterator_start_position(&old_iter);
  Length next_position = iterator_start_position(&new_iter);
  if (position.bytes < next_position.bytes) {
    ts_range_array_add(&results, position, next_position);
    position = next_position;
  } else if (position.bytes > next_position.bytes) {
    ts_range_array_add(&results, next_position, position);
    next_position = position;
  }

  do {
    #ifdef DEBUG_GET_CHANGED_RANGES
    printf("At [%-2u, %-2u] Compare ", position.extent.row, position.extent.column);
    iterator_print_state(&old_iter);
    printf("\tvs\t");
    iterator_print_state(&new_iter);
    puts("");
    #endif

    bool is_changed = false;
    switch (iterator_compare(&old_iter, &new_iter)) {
      case IteratorMatches:
        next_position = iterator_end_position(&old_iter);
        if (ts_range_array_intersects(
          included_range_differences,
          included_range_difference_index,
          position.bytes, next_position.bytes
        )) {
          next_position = position;
          // fall through
        } else {
          break;
        }

      case IteratorMayDiffer:
        if (iterator_descend(&old_iter, position.bytes)) {
          if (!iterator_descend(&new_iter, position.bytes)) {
            is_changed = true;
            next_position = iterator_end_position(&old_iter);
          }
        } else if (iterator_descend(&new_iter, position.bytes)) {
          is_changed = true;
          next_position = iterator_end_position(&new_iter);
        } else {
          next_position = length_min(
            iterator_end_position(&old_iter),
            iterator_end_position(&new_iter)
          );
        }
        break;

      case IteratorDiffers:
        is_changed = true;
        next_position = length_min(
          iterator_end_position(&old_iter),
          iterator_end_position(&new_iter)
        );
        break;
    }

    while (
      !iterator_done(&old_iter) &&
      iterator_end_position(&old_iter).bytes <= next_position.bytes
    ) iterator_advance(&old_iter);

    while (
      !iterator_done(&new_iter) &&
      iterator_end_position(&new_iter).bytes <= next_position.bytes
    ) iterator_advance(&new_iter);

    while (old_iter.visible_depth > new_iter.visible_depth) iterator_ascend(&old_iter);

    while (new_iter.visible_depth > old_iter.visible_depth) iterator_ascend(&new_iter);

    if (is_changed) {
      #ifdef DEBUG_GET_CHANGED_RANGES
      printf(
        "  change: [[%u, %u] - [%u, %u]]\n",
        position.extent.row, position.extent.column,
        next_position.extent.row, next_position.extent.column
      );
      #endif

      ts_range_array_add(&results, position, next_position);
    }

    position = next_position;

    while (included_range_difference_index < included_range_differences->size) {
      const TSRange *range = &included_range_differences->contents[included_range_difference_index];
      if (range->end_byte <= position.bytes) {
        included_range_difference_index++;
      } else {
        break;
      }
    }
  } while (!iterator_done(&old_iter) && !iterator_done(&new_iter));

  Length old_size = ts_subtree_total_size(*old_tree);
  Length new_size = ts_subtree_total_size(*new_tree);
  if (old_size.bytes < new_size.bytes) {
    ts_range_array_add(&results, old_size, new_size);
  } else if (new_size.bytes < old_size.bytes) {
    ts_range_array_add(&results, new_size, old_size);
  }

  *cursor1 = old_iter.cursor;
  *cursor2 = new_iter.cursor;
  *ranges = results.contents;
  return results.size;
}